

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O1

int __thiscall zmq::ipc_listener_t::close(ipc_listener_t *this,int __fd)

{
  socket_base_t *psVar1;
  int iVar2;
  int iVar3;
  int __fd_00;
  endpoint_uri_pair_t local_68;
  
  if ((this->super_stream_listener_base_t)._s == -1) {
    close((int)this);
  }
  iVar3 = (this->super_stream_listener_base_t)._s;
  __fd_00 = iVar3;
  iVar2 = ::close(iVar3);
  if (iVar2 != 0) {
    close(__fd_00);
  }
  (this->super_stream_listener_base_t)._s = -1;
  if ((this->_has_file == true) &&
     ((this->super_stream_listener_base_t).super_own_t.options.use_fd == -1)) {
    if (((this->_tmp_socket_dirname)._M_string_length != 0) &&
       (iVar2 = unlink((this->_filename)._M_dataplus._M_p), iVar2 == 0)) {
      iVar2 = rmdir((this->_tmp_socket_dirname)._M_dataplus._M_p);
      (this->_tmp_socket_dirname)._M_string_length = 0;
      *(this->_tmp_socket_dirname)._M_dataplus._M_p = '\0';
    }
    if (iVar2 != 0) {
      psVar1 = (this->super_stream_listener_base_t)._socket;
      make_unconnected_bind_endpoint_pair(&local_68,&(this->super_stream_listener_base_t)._endpoint)
      ;
      iVar3 = zmq_errno();
      socket_base_t::event_close_failed(psVar1,&local_68,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.remote._M_dataplus._M_p != &local_68.remote.field_2) {
        operator_delete(local_68.remote._M_dataplus._M_p,
                        local_68.remote.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.local._M_dataplus._M_p != &local_68.local.field_2) {
        operator_delete(local_68.local._M_dataplus._M_p,
                        local_68.local.field_2._M_allocated_capacity + 1);
      }
      return -1;
    }
  }
  psVar1 = (this->super_stream_listener_base_t)._socket;
  make_unconnected_bind_endpoint_pair(&local_68,&(this->super_stream_listener_base_t)._endpoint);
  socket_base_t::event_closed(psVar1,&local_68,iVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.remote._M_dataplus._M_p != &local_68.remote.field_2) {
    operator_delete(local_68.remote._M_dataplus._M_p,
                    local_68.remote.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.local._M_dataplus._M_p != &local_68.local.field_2) {
    operator_delete(local_68.local._M_dataplus._M_p,local_68.local.field_2._M_allocated_capacity + 1
                   );
  }
  return 0;
}

Assistant:

int zmq::ipc_listener_t::close ()
{
    zmq_assert (_s != retired_fd);
    const fd_t fd_for_event = _s;
#ifdef ZMQ_HAVE_WINDOWS
    int rc = closesocket (_s);
    wsa_assert (rc != SOCKET_ERROR);
#else
    int rc = ::close (_s);
    errno_assert (rc == 0);
#endif

    _s = retired_fd;

    if (_has_file && options.use_fd == -1) {
        if (!_tmp_socket_dirname.empty ()) {
            //  TODO review this behaviour, it is inconsistent with the use of
            //  unlink in open since 656cdb959a7482c45db979c1d08ede585d12e315;
            //  however, we must at least remove the file before removing the
            //  directory, otherwise it will always fail
            rc = ::unlink (_filename.c_str ());

            if (rc == 0) {
                rc = ::rmdir (_tmp_socket_dirname.c_str ());
                _tmp_socket_dirname.clear ();
            }
        }

        if (rc != 0) {
            _socket->event_close_failed (
              make_unconnected_bind_endpoint_pair (_endpoint), zmq_errno ());
            return -1;
        }
    }

    _socket->event_closed (make_unconnected_bind_endpoint_pair (_endpoint),
                           fd_for_event);
    return 0;
}